

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_UInt16 addNamespace(UA_Server *server,UA_String name)

{
  ulong uVar1;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  UA_String *pUVar4;
  UA_UInt16 i;
  size_t sVar5;
  undefined1 local_40 [8];
  UA_String name_local;
  
  name_local.length = (size_t)name.data;
  local_40 = (undefined1  [8])name.length;
  uVar1 = server->namespacesSize;
  pUVar4 = server->namespaces;
  sVar5 = 0;
  while( true ) {
    if (uVar1 <= (sVar5 & 0xffff)) break;
    UVar2 = UA_String_equal((UA_String *)local_40,
                            (UA_String *)
                            ((long)&pUVar4->length + (ulong)(uint)((int)(sVar5 & 0xffff) << 4)));
    if (UVar2) goto LAB_00113c8c;
    sVar5 = (size_t)((int)sVar5 + 1);
  }
  pUVar4 = (UA_String *)realloc(pUVar4,uVar1 * 0x10 + 0x10);
  if (pUVar4 != (UA_String *)0x0) {
    server->namespaces = pUVar4;
    UVar3 = UA_String_copy((UA_String *)local_40,pUVar4 + server->namespacesSize);
    if (UVar3 == 0) {
      sVar5 = server->namespacesSize;
      server->namespacesSize = sVar5 + 1;
      goto LAB_00113c8c;
    }
  }
  sVar5 = 0;
LAB_00113c8c:
  return (UA_UInt16)sVar5;
}

Assistant:

UA_UInt16 addNamespace(UA_Server *server, const UA_String name) {
    /* Check if the namespace already exists in the server's namespace array */
    for(UA_UInt16 i=0;i<server->namespacesSize;++i) {
        if(UA_String_equal(&name, &server->namespaces[i]))
            return i;
    }

    /* Add a new namespace to the namsepace array */
    UA_String *newNS = UA_realloc(server->namespaces,
                                  sizeof(UA_String) * (server->namespacesSize + 1));
    if(!newNS)
        return 0;
    server->namespaces = newNS;
    UA_StatusCode retval = UA_String_copy(&name, &server->namespaces[server->namespacesSize]);
    if(retval != UA_STATUSCODE_GOOD)
        return 0;
    ++server->namespacesSize;
    return (UA_UInt16)(server->namespacesSize - 1);
}